

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralNumber * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::LiteralNumber>
          (Allocator *this,LiteralNumber *ast)

{
  LiteralNumber *this_00;
  LiteralNumber *local_20;
  
  this_00 = (LiteralNumber *)operator_new(0xa8);
  LiteralNumber::LiteralNumber(this_00,ast);
  local_20 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_20);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }